

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O1

void __thiscall spvtools::opt::IrLoader::EndModule(IrLoader *this)

{
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_00;
  Function *pFVar1;
  const_iterator __position;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> __ptr_00;
  Module *pMVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  value_type *__range3;
  pointer *__ptr;
  pointer puVar6;
  BasicBlock *local_38;
  BasicBlock *local_30;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_28;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_20;
  
  if (((this->block_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0)
     && (pFVar1 = (this->function_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                  .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,
        pFVar1 != (Function *)0x0)) {
    this_00 = &this->block_;
    local_28._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
    local_38 = (BasicBlock *)0x0;
    __position._M_current =
         *(pointer *)
          ((long)&(pFVar1->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data + 8);
    (local_28._M_head_impl)->function_ = pFVar1;
    local_30 = (BasicBlock *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
    ::_M_insert_rval(&pFVar1->blocks_,__position,(value_type *)&local_28);
    if (local_28._M_head_impl != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_28,local_28._M_head_impl);
    }
    if (local_30 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_30,local_30);
    }
    if (local_38 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_38,local_38);
    }
    local_38 = (BasicBlock *)0x0;
    __ptr_00._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
    if (__ptr_00._M_head_impl != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)this_00,__ptr_00._M_head_impl);
    }
  }
  if ((this->function_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl != (Function *)0x0) {
    pMVar2 = this->module_;
    local_20._M_head_impl =
         (this->function_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
         .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    (this->function_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl = (Function *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
              ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                *)&pMVar2->functions_,
               (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *
               )&local_20);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&local_20);
    std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *
          )&this->function_,(pointer)0x0);
  }
  pMVar2 = this->module_;
  puVar3 = (pMVar2->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (pMVar2->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    pFVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    puVar4 = *(pointer *)
              ((long)&(pFVar1->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl + 8);
    for (puVar6 = *(pointer *)
                   &(pFVar1->blocks_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    ._M_impl; puVar6 != puVar4; puVar6 = puVar6 + 1) {
      *(Function **)
       (puVar6->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           = pFVar1;
    }
  }
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
  _M_move_assign(&pMVar2->trailing_dbg_line_info_,&this->dbg_line_info_);
  return;
}

Assistant:

void IrLoader::EndModule() {
  if (block_ && function_) {
    // We're in the middle of a basic block, but the terminator is missing.
    // Register the block anyway.  This lets us write tests with less
    // boilerplate.
    function_->AddBasicBlock(std::move(block_));
    block_ = nullptr;
  }
  if (function_) {
    // We're in the middle of a function, but the OpFunctionEnd is missing.
    // Register the function anyway.  This lets us write tests with less
    // boilerplate.
    module_->AddFunction(std::move(function_));
    function_ = nullptr;
  }
  for (auto& function : *module_) {
    for (auto& bb : function) bb.SetParent(&function);
  }

  // Copy any trailing Op*Line instruction into the module
  module_->SetTrailingDbgLineInfo(std::move(dbg_line_info_));
}